

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CDirectiveConditional.cpp
# Opt level: O0

void __thiscall
CDirectiveConditional::CDirectiveConditional
          (CDirectiveConditional *this,ConditionType type,Identifier *name)

{
  bool bVar1;
  Identifier *args;
  undefined1 local_30 [24];
  Identifier *name_local;
  CDirectiveConditional *pCStack_10;
  ConditionType type_local;
  CDirectiveConditional *this_local;
  
  local_30._16_8_ = name;
  name_local._4_4_ = type;
  pCStack_10 = this;
  CDirectiveConditional(this,type);
  args = (Identifier *)(ulong)(uint)Global.FileInfo.FileNum;
  SymbolTable::getLabel
            ((SymbolTable *)local_30,(Identifier *)&Global.symbolTable,(int)local_30._16_8_,
             Global.FileInfo.FileNum);
  std::shared_ptr<Label>::operator=(&this->label,(shared_ptr<Label> *)local_30);
  std::shared_ptr<Label>::~shared_ptr((shared_ptr<Label> *)local_30);
  bVar1 = std::operator==(&this->label,(nullptr_t)0x0);
  if (bVar1) {
    Logger::printError<Identifier>((Logger *)0x1,0x21f34d,(char *)local_30._16_8_,args);
  }
  return;
}

Assistant:

CDirectiveConditional::CDirectiveConditional(ConditionType type, const Identifier& name)
	: CDirectiveConditional(type)
{
	label = Global.symbolTable.getLabel(name,Global.FileInfo.FileNum,Global.Section);
	if (label == nullptr)
		Logger::printError(Logger::Error, "Invalid label name \"%s\"",name);
}